

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall irr::video::COpenGL3DriverBase::setRenderStates3DMode(COpenGL3DriverBase *this)

{
  int iVar1;
  bool bVar2;
  u32 uVar3;
  SMaterialRenderer *pSVar4;
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *in_RDI;
  SMaterial *unaff_retaddr;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar5;
  GLenum in_stack_ffffffffffffffe8;
  uint uVar6;
  uint in_stack_ffffffffffffffec;
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *b;
  
  if ((in_RDI[7].FrameBufferID & 0x100) == 0) {
    b = in_RDI;
    if (in_RDI[0xc].ViewportWidth != 2) {
      COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
      ::setBlend((COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
                  *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 SUB41(in_stack_ffffffffffffffdc >> 0x18,0));
      COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
      ::setBlendFunc(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      *(undefined1 *)&in_RDI[7].FrameBufferID = 1;
    }
    if (((in_RDI[7].FrameBufferID & 1) != 0) ||
       (bVar2 = SMaterial::operator!=(unaff_retaddr,(SMaterial *)b), bVar2)) {
      if ((in_RDI[0xc].ViewportWidth == 1) && (in_RDI[10].BlendDestinationRGB != (GLenum *)0x0)) {
        (**(code **)(*(long *)in_RDI[10].BlendDestinationRGB + 0x10))();
        in_RDI[10].BlendDestinationRGB = (GLenum *)0x0;
      }
      else {
        iVar1._0_1_ = in_RDI[0xd].DepthMask;
        iVar1._1_1_ = in_RDI[0xd].DepthTest;
        iVar1._2_2_ = *(undefined2 *)&in_RDI[0xd].field_0xa2;
        if (*(int *)&in_RDI[0xe].CullFace != iVar1) {
          in_stack_ffffffffffffffec = *(uint *)&in_RDI[0xe].CullFace;
          uVar3 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                            ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x35de3a);
          if (in_stack_ffffffffffffffec < uVar3) {
            pSVar4 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                               ((array<irr::video::CNullDriver::SMaterialRenderer> *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
            (*pSVar4->Renderer->_vptr_IMaterialRenderer[2])();
          }
        }
      }
      uVar6._0_1_ = in_RDI[0xd].DepthMask;
      uVar6._1_1_ = in_RDI[0xd].DepthTest;
      uVar6._2_2_ = *(undefined2 *)&in_RDI[0xd].field_0xa2;
      uVar3 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                        ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x35de85);
      if (uVar6 < uVar3) {
        pSVar4 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                           ((array<irr::video::CNullDriver::SMaterialRenderer> *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
        (**pSVar4->Renderer->_vptr_IMaterialRenderer)
                  (pSVar4->Renderer,in_RDI[0xd].TextureCache.Texture,
                   &in_RDI[0xe].TextureCache.DriverType,(ulong)((byte)in_RDI[7].FrameBufferID & 1),
                   &in_RDI[6].TextureCache);
      }
      SMaterial::operator=
                ((SMaterial *)in_RDI,(SMaterial *)CONCAT44(in_stack_ffffffffffffffec,uVar6));
      COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
      ::correctCacheMaterial(in_RDI,(SMaterial *)CONCAT44(in_stack_ffffffffffffffec,uVar6));
      *(undefined1 *)&in_RDI[7].FrameBufferID = 0;
    }
    uVar5._0_1_ = in_RDI[0xd].DepthMask;
    uVar5._1_1_ = in_RDI[0xd].DepthTest;
    uVar5._2_2_ = *(undefined2 *)&in_RDI[0xd].field_0xa2;
    uVar3 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                      ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x35df39);
    if (uVar5 < uVar3) {
      pSVar4 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                         ((array<irr::video::CNullDriver::SMaterialRenderer> *)
                          CONCAT44(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
      (*pSVar4->Renderer->_vptr_IMaterialRenderer[1])(pSVar4->Renderer,&in_RDI[6].TextureCache,0);
    }
    in_RDI[0xc].ViewportWidth = 2;
  }
  return;
}

Assistant:

void COpenGL3DriverBase::setRenderStates3DMode()
{
	if (LockRenderStateMode)
		return;

	if (CurrentRenderMode != ERM_3D) {
		// Reset Texture Stages
		CacheHandler->setBlend(false);
		CacheHandler->setBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

		ResetRenderStates = true;
	}

	if (ResetRenderStates || LastMaterial != Material) {
		// unset old material

		// unset last 3d material
		if (CurrentRenderMode == ERM_2D && MaterialRenderer2DActive) {
			MaterialRenderer2DActive->OnUnsetMaterial();
			MaterialRenderer2DActive = 0;
		} else if (LastMaterial.MaterialType != Material.MaterialType &&
				   static_cast<u32>(LastMaterial.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[LastMaterial.MaterialType].Renderer->OnUnsetMaterial();

		// set new material.
		if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[Material.MaterialType].Renderer->OnSetMaterial(
					Material, LastMaterial, ResetRenderStates, this);

		LastMaterial = Material;
		CacheHandler->correctCacheMaterial(LastMaterial);
		ResetRenderStates = false;
	}

	if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
		MaterialRenderers[Material.MaterialType].Renderer->OnRender(this, video::EVT_STANDARD);

	CurrentRenderMode = ERM_3D;
}